

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamFtp::ConnectCommandSocket(BamFtp *this)

{
  bool bVar1;
  char __rhs;
  undefined1 uVar2;
  long *in_RDI;
  OpenMode in_stack_00000040;
  uint16_t in_stack_00000046;
  string *in_stack_00000048;
  TcpSocket *in_stack_00000050;
  string typeCommand;
  string passwordCommand;
  string userCommand;
  undefined5 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe45;
  undefined1 in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_stack_fffffffffffffe50;
  allocator *paVar3;
  char __rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string local_198 [32];
  string local_178 [24];
  string *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffea8;
  IBamIODevice *in_stack_fffffffffffffeb0;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [23];
  undefined1 in_stack_ffffffffffffff1f;
  string *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  string local_d0 [8];
  BamFtp *in_stack_ffffffffffffff38;
  string local_b0 [32];
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  __rhs_00 = (char)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  bamtools_noop();
  bVar1 = TcpSocket::ConnectToHost
                    (in_stack_00000050,in_stack_00000048,in_stack_00000046,in_stack_00000040);
  if (bVar1) {
    bVar1 = ReceiveReply(in_stack_ffffffffffffff38);
    if (bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
      std::operator+(in_stack_fffffffffffffe58,__rhs_00);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,
                                             CONCAT15(in_stack_fffffffffffffe45,
                                                      in_stack_fffffffffffffe40))));
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe47,
                                    CONCAT16(in_stack_fffffffffffffe46,
                                             CONCAT15(in_stack_fffffffffffffe45,
                                                      in_stack_fffffffffffffe40))));
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_d0);
      __rhs = SendCommand((BamFtp *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
      if ((bool)__rhs) {
        std::operator+(in_stack_fffffffffffffe58,__rhs_00);
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(__rhs,CONCAT16(in_stack_fffffffffffffe46,
                                                     CONCAT15(in_stack_fffffffffffffe45,
                                                              in_stack_fffffffffffffe40))));
        std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(__rhs,CONCAT16(in_stack_fffffffffffffe46,
                                                     CONCAT15(in_stack_fffffffffffffe45,
                                                              in_stack_fffffffffffffe40))));
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_138);
        uVar2 = SendCommand((BamFtp *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
        if ((bool)uVar2) {
          std::operator+(in_stack_fffffffffffffe58,__rhs_00);
          std::operator+(__lhs,__rhs);
          std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(__rhs,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe45,
                                                                      in_stack_fffffffffffffe40))));
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string(local_198);
          local_1 = SendCommand((BamFtp *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f);
          if (!(bool)local_1) {
            (**(code **)(*in_RDI + 0x10))();
          }
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
        }
        else {
          (**(code **)(*in_RDI + 0x10))();
          local_1 = 0;
        }
        std::__cxx11::string::~string(local_f8);
      }
      else {
        (**(code **)(*in_RDI + 0x10))();
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_90);
    }
    else {
      (**(code **)(*in_RDI + 0x10))();
      local_1 = 0;
    }
  }
  else {
    paVar3 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"BamFtp::ConnectCommandSocket",paVar3);
    paVar3 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"could not connect to host - ",paVar3);
    IBamIODevice::SetErrorString
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamFtp::ConnectCommandSocket(void) {

    BT_ASSERT_X(m_commandSocket, "null command socket?");

    // connect to FTP server
    if ( !m_commandSocket->ConnectToHost(m_hostname, m_port, m_mode) ) {
        SetErrorString("BamFtp::ConnectCommandSocket", "could not connect to host - ");
        return false;
    }

    // receive initial reply from host
    if ( !ReceiveReply() ) {
        Close();
        return false;
    }

    // send USER command
    string userCommand = USER_CMD + CMD_SEPARATOR + m_username + FTP_NEWLINE;
    if ( !SendCommand(userCommand, true) ) {
        Close();
        return false;
    }

    // send PASS command
    string passwordCommand = PASS_CMD + CMD_SEPARATOR + m_password + FTP_NEWLINE;
    if ( !SendCommand(passwordCommand, true) ) {
        Close();
        return false;
    }

    // send TYPE command
    string typeCommand = TYPE_CMD + CMD_SEPARATOR + 'I' + FTP_NEWLINE;
    if ( !SendCommand(typeCommand, true) ) {
        Close();
        return false;
    }

    // return success
    return true;
}